

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

Status sentencepiece::SentencePieceTrainer::MergeSpecsFromArgs
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *kwargs,TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
                 NormalizerSpec *denormalizer_spec)

{
  bool bVar1;
  reference this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  StatusBuilder *this_01;
  long in_RCX;
  long in_RDX;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  long in_R8;
  Status status_norm;
  Status status_train;
  NormalizerSpec *in_stack_000001c8;
  undefined1 in_stack_000001d0 [16];
  string_view in_stack_000001e0;
  int v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  TrainerSpec *in_stack_00003918;
  string_view in_stack_00003920;
  string_view in_stack_00003930;
  undefined4 in_stack_fffffffffffff7e8;
  StatusCode in_stack_fffffffffffff7ec;
  undefined4 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f4;
  undefined1 in_stack_fffffffffffff7f5;
  undefined1 in_stack_fffffffffffff7f6;
  undefined1 in_stack_fffffffffffff7f7;
  Status *in_stack_fffffffffffff828;
  Status *in_stack_fffffffffffff830;
  StatusBuilder *in_stack_fffffffffffff838;
  StatusCode local_6c4;
  int *in_stack_fffffffffffff9a0;
  string_view in_stack_fffffffffffff9a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_4e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_4d8 [2];
  undefined4 local_4c4;
  undefined4 local_33c;
  undefined4 local_1b8;
  
  if (in_RDX == 0) {
    util::StatusBuilder::StatusBuilder
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               in_stack_fffffffffffff7ec);
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [55])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_1b8 = 0x85;
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (int *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [4])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [13])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [3])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [33])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffff838);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4d114e);
  }
  else if (in_RCX == 0) {
    util::StatusBuilder::StatusBuilder
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               in_stack_fffffffffffff7ec);
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [55])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_33c = 0x86;
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (int *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [4])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [16])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [3])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [36])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffff838);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4d12a5);
  }
  else if (in_R8 == 0) {
    util::StatusBuilder::StatusBuilder
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               in_stack_fffffffffffff7ec);
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [55])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [2])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_4c4 = 0x87;
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (int *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [4])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [18])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [3])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator<<
              ((StatusBuilder *)
               CONCAT17(in_stack_fffffffffffff7f7,
                        CONCAT16(in_stack_fffffffffffff7f6,
                                 CONCAT15(in_stack_fffffffffffff7f5,
                                          CONCAT14(in_stack_fffffffffffff7f4,
                                                   in_stack_fffffffffffff7f0)))),
               (char (*) [38])CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffff838);
    util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4d13de);
  }
  else {
    local_4d8[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_4e0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_6c4 = in_stack_fffffffffffff7ec;
    while (bVar1 = std::__detail::operator!=(local_4d8,&local_4e0), bVar1) {
      this = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                          *)0x4d146e);
      this_00 = &this->second;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff7f7,
                                       CONCAT16(in_stack_fffffffffffff7f6,
                                                CONCAT15(in_stack_fffffffffffff7f5,
                                                         CONCAT14(in_stack_fffffffffffff7f4,
                                                                  in_stack_fffffffffffff7f0)))),
                              (char *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
      if (bVar1) {
        NormalizerSpec::set_name
                  ((NormalizerSpec *)
                   CONCAT17(in_stack_fffffffffffff7f7,
                            CONCAT16(in_stack_fffffffffffff7f6,
                                     CONCAT15(in_stack_fffffffffffff7f5,
                                              CONCAT14(in_stack_fffffffffffff7f4,
                                                       in_stack_fffffffffffff7f0)))),
                   (string *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff7f7,
                                          CONCAT16(in_stack_fffffffffffff7f6,
                                                   CONCAT15(in_stack_fffffffffffff7f5,
                                                            CONCAT14(in_stack_fffffffffffff7f4,
                                                                     in_stack_fffffffffffff7f0)))),
                                (char *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
        if (bVar1) {
          NormalizerSpec::set_normalization_rule_tsv
                    ((NormalizerSpec *)
                     CONCAT17(in_stack_fffffffffffff7f7,
                              CONCAT16(in_stack_fffffffffffff7f6,
                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                         in_stack_fffffffffffff7f0)))),
                     (string *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
          NormalizerSpec::set_add_dummy_prefix
                    ((NormalizerSpec *)
                     CONCAT17(in_stack_fffffffffffff7f7,
                              CONCAT16(in_stack_fffffffffffff7f6,
                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                         in_stack_fffffffffffff7f0)))),
                     SUB41(local_6c4 >> 0x18,0));
          NormalizerSpec::set_remove_extra_whitespaces
                    ((NormalizerSpec *)
                     CONCAT17(in_stack_fffffffffffff7f7,
                              CONCAT16(in_stack_fffffffffffff7f6,
                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                         in_stack_fffffffffffff7f0)))),
                     SUB41(local_6c4 >> 0x18,0));
          NormalizerSpec::set_escape_whitespaces
                    ((NormalizerSpec *)
                     CONCAT17(in_stack_fffffffffffff7f7,
                              CONCAT16(in_stack_fffffffffffff7f6,
                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                         in_stack_fffffffffffff7f0)))),
                     SUB41(local_6c4 >> 0x18,0));
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff7f7,
                                              CONCAT16(in_stack_fffffffffffff7f6,
                                                       CONCAT15(in_stack_fffffffffffff7f5,
                                                                CONCAT14(in_stack_fffffffffffff7f4,
                                                                         in_stack_fffffffffffff7f0))
                                                      )),
                                  (char *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
          if (bVar1) {
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
            bVar1 = absl::SimpleAtoi<int>(in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
            if (!bVar1) {
              util::StatusBuilder::StatusBuilder
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),local_6c4
                        );
              this_01 = util::StatusBuilder::operator<<
                                  ((StatusBuilder *)
                                   CONCAT17(in_stack_fffffffffffff7f7,
                                            CONCAT16(in_stack_fffffffffffff7f6,
                                                     CONCAT15(in_stack_fffffffffffff7f5,
                                                              CONCAT14(in_stack_fffffffffffff7f4,
                                                                       in_stack_fffffffffffff7f0))))
                                   ,(char (*) [55])CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator<<
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),
                         (char (*) [2])CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator<<
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),
                         (int *)CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator<<
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),
                         (char (*) [4])CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator<<
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),
                         (char (*) [28])CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator<<
                        ((StatusBuilder *)
                         CONCAT17(in_stack_fffffffffffff7f7,
                                  CONCAT16(in_stack_fffffffffffff7f6,
                                           CONCAT15(in_stack_fffffffffffff7f5,
                                                    CONCAT14(in_stack_fffffffffffff7f4,
                                                             in_stack_fffffffffffff7f0)))),
                         (char (*) [3])CONCAT44(local_6c4,in_stack_fffffffffffff7e8));
              util::StatusBuilder::operator_cast_to_Status(this_01);
              util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x4d1670);
              return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                        )in_RDI._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl;
            }
            logging::SetMinLogLevel(local_6c4);
          }
          else {
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
            SetProtoField(in_stack_00003930,in_stack_00003920,in_stack_00003918);
            bVar1 = util::Status::ok((Status *)0x4d172e);
            if (bVar1) {
              local_6c4 = kInvalidArgument;
            }
            else {
              in_stack_fffffffffffff7f7 = util::IsNotFound((Status *)0x4d1774);
              if ((bool)in_stack_fffffffffffff7f7) {
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
                SetProtoField(in_stack_000001e0,(string_view)in_stack_000001d0,in_stack_000001c8);
                in_stack_fffffffffffff7f6 = util::Status::ok((Status *)0x4d1829);
                if ((bool)in_stack_fffffffffffff7f6) {
                  local_6c4 = kInvalidArgument;
                }
                else {
                  in_stack_fffffffffffff7f5 = util::IsNotFound((Status *)0x4d187c);
                  if ((bool)in_stack_fffffffffffff7f5) {
                    in_stack_fffffffffffff7f4 = util::IsNotFound((Status *)0x4d18bd);
                    if ((bool)in_stack_fffffffffffff7f4) {
                      bVar1 = util::IsNotFound((Status *)0x4d18da);
                      in_stack_fffffffffffff7f0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7f0);
                      if (bVar1) {
                        util::Status::Status(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
                        local_6c4 = kCancelled;
                        goto LAB_004d1919;
                      }
                    }
                    local_6c4 = kOk;
                  }
                  else {
                    util::Status::Status(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
                    local_6c4 = kCancelled;
                  }
                }
LAB_004d1919:
                util::Status::~Status((Status *)0x4d1926);
              }
              else {
                util::Status::Status(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
                local_6c4 = kCancelled;
              }
            }
            util::Status::~Status((Status *)0x4d1933);
            if ((local_6c4 != kOk) && (local_6c4 == kCancelled)) {
              return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                      )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                        )in_RDI._M_t.
                         super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                         .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                         _M_head_impl;
            }
          }
        }
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)CONCAT17(in_stack_fffffffffffff7f7,
                               CONCAT16(in_stack_fffffffffffff7f6,
                                        CONCAT15(in_stack_fffffffffffff7f5,
                                                 CONCAT14(in_stack_fffffffffffff7f4,
                                                          in_stack_fffffffffffff7f0)))));
    }
    util::OkStatus();
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::MergeSpecsFromArgs(
    const std::unordered_map<std::string, std::string> &kwargs,
    TrainerSpec *trainer_spec, NormalizerSpec *normalizer_spec,
    NormalizerSpec *denormalizer_spec) {
  CHECK_OR_RETURN(trainer_spec) << "`trainer_spec` must not be null.";
  CHECK_OR_RETURN(normalizer_spec) << "`normalizer_spec` must not be null.";
  CHECK_OR_RETURN(denormalizer_spec) << "`denormalizer_spec` must not be null.";

  for (const auto &it : kwargs) {
    const auto &key = it.first;
    const auto &value = it.second;
    // Exceptions.
    if (key == "normalization_rule_name") {
      normalizer_spec->set_name(value);
      continue;
    } else if (key == "denormalization_rule_tsv") {
      denormalizer_spec->set_normalization_rule_tsv(value);
      denormalizer_spec->set_add_dummy_prefix(false);
      denormalizer_spec->set_remove_extra_whitespaces(false);
      denormalizer_spec->set_escape_whitespaces(false);
      continue;
    } else if (key == "minloglevel") {
      int v = 0;
      CHECK_OR_RETURN(absl::SimpleAtoi(value, &v));
      logging::SetMinLogLevel(v);
      continue;
    }

    const auto status_train = SetProtoField(key, value, trainer_spec);
    if (status_train.ok()) continue;
    if (!util::IsNotFound(status_train)) return status_train;

    const auto status_norm = SetProtoField(key, value, normalizer_spec);
    if (status_norm.ok()) continue;
    if (!util::IsNotFound(status_norm)) return status_norm;

    // Not found both in trainer_spec and normalizer_spec.
    if (util::IsNotFound(status_train) && util::IsNotFound(status_norm)) {
      return status_train;
    }
  }

  return util::OkStatus();
}